

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject * luaC_newobjdt(lua_State *L,int tt,size_t sz,size_t offset)

{
  global_State *pgVar1;
  void *pvVar2;
  GCObject *pGVar3;
  GCObject *o;
  char *p;
  global_State *g;
  size_t offset_local;
  size_t sz_local;
  int tt_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  pvVar2 = luaM_malloc_(L,sz,tt & 0xf);
  pGVar3 = (GCObject *)((long)pvVar2 + offset);
  pGVar3->marked = pgVar1->currentwhite & 0x18;
  pGVar3->tt = (lu_byte)tt;
  pGVar3->next = pgVar1->allgc;
  pgVar1->allgc = pGVar3;
  return pGVar3;
}

Assistant:

GCObject *luaC_newobjdt (lua_State *L, int tt, size_t sz, size_t offset) {
  global_State *g = G(L);
  char *p = cast_charp(luaM_newobject(L, novariant(tt), sz));
  GCObject *o = cast(GCObject *, p + offset);
  o->marked = luaC_white(g);
  o->tt = tt;
  o->next = g->allgc;
  g->allgc = o;
  return o;
}